

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SliderBehaviorT<unsigned_long_long,long_long,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,unsigned_long_long *v,
               unsigned_long_long v_min,unsigned_long_long v_max,char *format,ImGuiSliderFlags flags
               ,ImRect *out_grab_bb)

{
  ImVec2 IVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  int iVar7;
  ImGuiContext *g;
  unsigned_long_long uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  long lVar12;
  bool bVar13;
  float fVar14;
  float t;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [64];
  float fVar21;
  float fVar22;
  float zero_deadzone_halfsize;
  undefined1 extraout_var [56];
  
  pIVar6 = GImGui;
  lVar12 = v_min - v_max;
  if (v_min < v_max) {
    lVar12 = -(v_min - v_max);
  }
  uVar9 = data_type & 0xfffffffe;
  uVar10 = flags & 0x100000;
  fVar18 = *(float *)((long)&(bb->Max).x + (ulong)(uVar10 >> 0x12));
  fVar22 = *(float *)((long)&(bb->Min).x + (ulong)(uVar10 >> 0x12));
  fVar2 = (fVar18 - fVar22) + -4.0;
  fVar14 = (GImGui->Style).GrabMinSize;
  if (-1 < lVar12 && uVar9 != 8) {
    fVar21 = fVar2 / (float)(lVar12 + 1);
    uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar14),ZEXT416((uint)fVar21),2);
    bVar11 = (bool)((byte)uVar4 & 1);
    fVar14 = (float)((uint)bVar11 * (int)fVar21 + (uint)!bVar11 * (int)fVar14);
  }
  auVar3 = vminss_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar2));
  zero_deadzone_halfsize = 0.0;
  fVar21 = 0.0;
  fVar14 = fVar2 - auVar3._0_4_;
  if ((flags & 0x20U) != 0) {
    if (uVar9 == 8) {
      iVar7 = ImParseFormatPrecision(format,3);
      fVar21 = (float)iVar7;
    }
    else {
      fVar21 = 1.0;
    }
    fVar21 = powf(0.1,fVar21);
    auVar15 = vmaxss_avx(ZEXT416((uint)fVar14),ZEXT416(0x3f800000));
    zero_deadzone_halfsize = ((pIVar6->Style).LogSliderDeadzone * 0.5) / auVar15._0_4_;
  }
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 + 2.0)),auVar3,SUB6416(ZEXT464(0x3f000000),0));
  fVar22 = auVar15._0_4_;
  if (pIVar6->ActiveId == id) {
    if (pIVar6->ActiveIdSource == ImGuiInputSource_Nav) {
      if (pIVar6->ActiveIdIsJustActivated == true) {
        pIVar6->SliderCurrentAccum = 0.0;
        pIVar6->SliderCurrentAccumDirty = false;
      }
      auVar20._0_8_ = GetNavInputAmount2d(6,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      auVar20._8_56_ = extraout_var;
      auVar15 = vmovshdup_avx(auVar20._0_16_);
      auVar16._8_4_ = 0x80000000;
      auVar16._0_8_ = 0x8000000080000000;
      auVar16._12_4_ = 0x80000000;
      auVar15 = vxorps_avx512vl(auVar15,auVar16);
      auVar15._0_4_ =
           (float)((uint)(uVar10 == 0) * (int)auVar20._0_4_ + (uint)(uVar10 != 0) * auVar15._0_4_);
      if ((auVar15._0_4_ != 0.0) || (NAN(auVar15._0_4_))) {
        if ((uVar9 == 8) && (iVar7 = ImParseFormatPrecision(format,3), 0 < iVar7)) {
          uVar4 = vcmpss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)(GImGui->IO).NavInputs[0xe]),1);
          bVar11 = (bool)((byte)uVar4 & 1);
          fVar14 = (float)((uint)bVar11 * (int)((auVar15._0_4_ / 100.0) / 10.0) +
                          (uint)!bVar11 * (int)(auVar15._0_4_ / 100.0));
        }
        else if ((lVar12 + 100U < 0xc9) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
          uVar4 = vcmpss_avx512f(auVar15,ZEXT816(0) << 0x40,1);
          bVar11 = (bool)((byte)uVar4 & 1);
          fVar14 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * 0x3f800000) / (float)lVar12;
        }
        else {
          fVar14 = auVar15._0_4_ / 100.0;
        }
        uVar4 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputs[0xf]),1);
        bVar11 = (bool)((byte)uVar4 & 1);
        fVar14 = (float)((uint)bVar11 * (int)(fVar14 * 10.0) + (uint)!bVar11 * (int)fVar14) +
                 pIVar6->SliderCurrentAccum;
        pIVar6->SliderCurrentAccum = fVar14;
        pIVar6->SliderCurrentAccumDirty = true;
      }
      else {
        fVar14 = pIVar6->SliderCurrentAccum;
      }
      if ((pIVar6->NavActivatePressedId == id) && (pIVar6->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if (pIVar6->SliderCurrentAccumDirty == true) {
        bVar11 = SUB41((flags & 0x20U) >> 5,0);
        fVar17 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                           (data_type,*v,v_min,v_max,bVar11,fVar21,zero_deadzone_halfsize);
        if (((fVar17 < 1.0) || (fVar14 <= 0.0)) && ((0.0 < fVar17 || (0.0 <= fVar14)))) {
          uVar4 = vcmpss_avx512f(ZEXT416((uint)(fVar14 + fVar17)),ZEXT816(0) << 0x40,1);
          auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar14 + fVar17)));
          t = (float)((uint)!(bool)((byte)uVar4 & 1) * auVar15._0_4_);
          uVar8 = ScaleValueFromRatioT<unsigned_long_long,long_long,double>
                            (data_type,t,v_min,v_max,bVar11,fVar21,zero_deadzone_halfsize);
          if ((flags & 0x40U) == 0) {
            uVar8 = RoundScalarWithFormatT<unsigned_long_long,long_long>(format,data_type,uVar8);
          }
          fVar19 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                             (data_type,uVar8,v_min,v_max,bVar11,fVar21,zero_deadzone_halfsize);
          fVar19 = fVar19 - fVar17;
          bVar11 = fVar14 <= fVar19;
          if (0.0 < fVar14) {
            bVar11 = fVar19 < fVar14;
          }
          pIVar6->SliderCurrentAccum =
               pIVar6->SliderCurrentAccum -
               (float)((uint)bVar11 * (int)fVar19 + (uint)!bVar11 * (int)fVar14);
          pIVar6->SliderCurrentAccumDirty = false;
          goto LAB_00297568;
        }
        pIVar6->SliderCurrentAccum = 0.0;
        pIVar6->SliderCurrentAccumDirty = false;
      }
    }
    else if (pIVar6->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar6->IO).MouseDown[0] == false) {
        ClearActiveID();
      }
      else {
        fVar17 = 0.0;
        if (0.0 < fVar14) {
          auVar16 = ZEXT416((uint)((*(float *)((pIVar6->IO).MouseDown +
                                              (ulong)(uVar10 >> 0x14) * 4 + -8) - fVar22) / fVar14))
          ;
          auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar16);
          uVar4 = vcmpss_avx512f(auVar16,ZEXT816(0),1);
          fVar17 = (float)((uint)!(bool)((byte)uVar4 & 1) * auVar15._0_4_);
        }
        t = (float)((uint)(uVar10 == 0) * (int)fVar17 + (uint)(uVar10 != 0) * (int)(1.0 - fVar17));
LAB_00297568:
        uVar8 = ScaleValueFromRatioT<unsigned_long_long,long_long,double>
                          (data_type,t,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),fVar21,
                           zero_deadzone_halfsize);
        if ((flags & 0x40U) == 0) {
          uVar8 = RoundScalarWithFormatT<unsigned_long_long,long_long>(format,data_type,uVar8);
        }
        if (*v != uVar8) {
          *v = uVar8;
          bVar11 = true;
          goto LAB_002978de;
        }
      }
    }
  }
  bVar11 = false;
LAB_002978de:
  if (1.0 <= fVar2) {
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar16 = vxorps_avx512vl(auVar3,auVar5);
    auVar15 = vfnmadd231ss_fma(ZEXT416((uint)(fVar18 + -2.0)),auVar3,SUB6416(ZEXT464(0x3f000000),0))
    ;
    fVar18 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                       (data_type,*v,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),fVar21,
                        zero_deadzone_halfsize);
    bVar13 = uVar10 == 0;
    auVar15 = vfmadd213ss_fma(ZEXT416((uint)(auVar15._0_4_ - fVar22)),
                              ZEXT416((uint)bVar13 * (int)fVar18 +
                                      (uint)!bVar13 * (int)(1.0 - fVar18)),ZEXT416((uint)fVar22));
    if (bVar13) {
      fVar18 = (bb->Min).y;
      fVar22 = (bb->Max).y;
      auVar16 = vfmadd213ss_fma(auVar16,SUB6416(ZEXT464(0x3f000000),0),auVar15);
      auVar3 = vfmadd213ss_fma(auVar3,SUB6416(ZEXT464(0x3f000000),0),auVar15);
      (out_grab_bb->Min).x = auVar16._0_4_;
      (out_grab_bb->Min).y = fVar18 + 2.0;
      (out_grab_bb->Max).x = auVar3._0_4_;
      (out_grab_bb->Max).y = fVar22 + -2.0;
    }
    else {
      fVar18 = (bb->Max).x;
      auVar16 = vfmadd213ss_fma(auVar16,SUB6416(ZEXT464(0x3f000000),0),auVar15);
      auVar3 = vfmadd213ss_fma(auVar3,SUB6416(ZEXT464(0x3f000000),0),auVar15);
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = auVar16._0_4_;
      (out_grab_bb->Max).x = fVar18 + -2.0;
      (out_grab_bb->Max).y = auVar3._0_4_;
    }
  }
  else {
    IVar1 = bb->Min;
    out_grab_bb->Min = IVar1;
    out_grab_bb->Max = IVar1;
  }
  return bVar11;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_floating_point && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}